

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slapack_lite.c
# Opt level: O0

int spotf2_(char *uplo,integer *n,real *a,integer *lda,integer *info)

{
  float fVar1;
  logical lVar2;
  doublereal dVar3;
  double dVar4;
  real local_68;
  float local_60;
  int local_5c;
  real r__1;
  integer i__3;
  integer i__2;
  integer i__1;
  integer a_offset;
  integer a_dim1;
  integer *info_local;
  integer *lda_local;
  real *a_local;
  integer *n_local;
  char *uplo_local;
  
  i__1 = *lda;
  i__2 = i__1 + 1;
  lda_local = (integer *)(a + -(long)i__2);
  *info = 0;
  _a_offset = info;
  info_local = lda;
  a_local = (real *)n;
  n_local = (integer *)uplo;
  spotf2_::upper = lsame_(uplo,"U");
  if ((spotf2_::upper == 0) && (lVar2 = lsame_((char *)n_local,"L"), lVar2 == 0)) {
    *_a_offset = -1;
  }
  else if ((int)*a_local < 0) {
    *_a_offset = -2;
  }
  else {
    if ((int)*a_local < 2) {
      local_68 = 1.4013e-45;
    }
    else {
      local_68 = *a_local;
    }
    if (*info_local < (int)local_68) {
      *_a_offset = -4;
    }
  }
  if (*_a_offset == 0) {
    if (*a_local != 0.0) {
      if (spotf2_::upper == 0) {
        i__3 = (integer)*a_local;
        for (spotf2_::j = 1; spotf2_::j <= i__3; spotf2_::j = spotf2_::j + 1) {
          r__1 = (real)(spotf2_::j + -1);
          fVar1 = (float)lda_local[spotf2_::j + spotf2_::j * i__1];
          dVar3 = sdot_((integer *)&r__1,(real *)(lda_local + (spotf2_::j + i__1)),info_local,
                        (real *)(lda_local + (spotf2_::j + i__1)),info_local);
          spotf2_::ajj = (real)((double)fVar1 - dVar3);
          if (spotf2_::ajj <= 0.0) {
            lda_local[spotf2_::j + spotf2_::j * i__1] = (integer)spotf2_::ajj;
            goto LAB_0011ba3e;
          }
          dVar4 = sqrt((double)spotf2_::ajj);
          spotf2_::ajj = (real)dVar4;
          lda_local[spotf2_::j + spotf2_::j * i__1] = (integer)spotf2_::ajj;
          if (spotf2_::j < (int)*a_local) {
            r__1 = (real)((int)*a_local - spotf2_::j);
            local_5c = spotf2_::j + -1;
            sgemv_("No transpose",(integer *)&r__1,&local_5c,&c_b181,
                   (real *)(lda_local + (spotf2_::j + 1 + i__1)),info_local,
                   (real *)(lda_local + (spotf2_::j + i__1)),info_local,&c_b164,
                   (real *)(lda_local + (spotf2_::j + 1 + spotf2_::j * i__1)),&c__1);
            r__1 = (real)((int)*a_local - spotf2_::j);
            local_60 = 1.0 / spotf2_::ajj;
            sscal_((integer *)&r__1,&local_60,
                   (real *)(lda_local + (spotf2_::j + 1 + spotf2_::j * i__1)),&c__1);
          }
        }
      }
      else {
        i__3 = (integer)*a_local;
        for (spotf2_::j = 1; spotf2_::j <= i__3; spotf2_::j = spotf2_::j + 1) {
          r__1 = (real)(spotf2_::j + -1);
          fVar1 = (float)lda_local[spotf2_::j + spotf2_::j * i__1];
          dVar3 = sdot_((integer *)&r__1,(real *)(lda_local + (spotf2_::j * i__1 + 1)),&c__1,
                        (real *)(lda_local + (spotf2_::j * i__1 + 1)),&c__1);
          spotf2_::ajj = (real)((double)fVar1 - dVar3);
          if (spotf2_::ajj <= 0.0) {
            lda_local[spotf2_::j + spotf2_::j * i__1] = (integer)spotf2_::ajj;
LAB_0011ba3e:
            *_a_offset = spotf2_::j;
            return 0;
          }
          dVar4 = sqrt((double)spotf2_::ajj);
          spotf2_::ajj = (real)dVar4;
          lda_local[spotf2_::j + spotf2_::j * i__1] = (integer)spotf2_::ajj;
          if (spotf2_::j < (int)*a_local) {
            r__1 = (real)(spotf2_::j + -1);
            local_5c = (int)*a_local - spotf2_::j;
            sgemv_("Transpose",(integer *)&r__1,&local_5c,&c_b181,
                   (real *)(lda_local + ((spotf2_::j + 1) * i__1 + 1)),info_local,
                   (real *)(lda_local + (spotf2_::j * i__1 + 1)),&c__1,&c_b164,
                   (real *)(lda_local + (spotf2_::j + (spotf2_::j + 1) * i__1)),info_local);
            r__1 = (real)((int)*a_local - spotf2_::j);
            local_60 = 1.0 / spotf2_::ajj;
            sscal_((integer *)&r__1,&local_60,
                   (real *)(lda_local + (spotf2_::j + (spotf2_::j + 1) * i__1)),info_local);
          }
        }
      }
    }
  }
  else {
    i__3 = -*_a_offset;
    xerbla_("SPOTF2",&i__3);
  }
  return 0;
}

Assistant:

int spotf2_(char *uplo, integer *n, real *a, integer *lda,
	integer *info)
{
    /* System generated locals */
    integer a_dim1, a_offset, i__1, i__2, i__3;
    real r__1;

    /* Builtin functions */
    double sqrt(doublereal);

    /* Local variables */
    static integer j;
    static real ajj;
    extern doublereal sdot_(integer *, real *, integer *, real *, integer *);
    extern logical lsame_(char *, char *);
    extern /* Subroutine */ int sscal_(integer *, real *, real *, integer *),
	    sgemv_(char *, integer *, integer *, real *, real *, integer *,
	    real *, integer *, real *, real *, integer *);
    static logical upper;
    extern /* Subroutine */ int xerbla_(char *, integer *);


/*
    -- LAPACK routine (version 3.0) --
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,
       Courant Institute, Argonne National Lab, and Rice University
       February 29, 1992


    Purpose
    =======

    SPOTF2 computes the Cholesky factorization of a real symmetric
    positive definite matrix A.

    The factorization has the form
       A = U' * U ,  if UPLO = 'U', or
       A = L  * L',  if UPLO = 'L',
    where U is an upper triangular matrix and L is lower triangular.

    This is the unblocked version of the algorithm, calling Level 2 BLAS.

    Arguments
    =========

    UPLO    (input) CHARACTER*1
            Specifies whether the upper or lower triangular part of the
            symmetric matrix A is stored.
            = 'U':  Upper triangular
            = 'L':  Lower triangular

    N       (input) INTEGER
            The order of the matrix A.  N >= 0.

    A       (input/output) REAL array, dimension (LDA,N)
            On entry, the symmetric matrix A.  If UPLO = 'U', the leading
            n by n upper triangular part of A contains the upper
            triangular part of the matrix A, and the strictly lower
            triangular part of A is not referenced.  If UPLO = 'L', the
            leading n by n lower triangular part of A contains the lower
            triangular part of the matrix A, and the strictly upper
            triangular part of A is not referenced.

            On exit, if INFO = 0, the factor U or L from the Cholesky
            factorization A = U'*U  or A = L*L'.

    LDA     (input) INTEGER
            The leading dimension of the array A.  LDA >= max(1,N).

    INFO    (output) INTEGER
            = 0: successful exit
            < 0: if INFO = -k, the k-th argument had an illegal value
            > 0: if INFO = k, the leading minor of order k is not
                 positive definite, and the factorization could not be
                 completed.

    =====================================================================


       Test the input parameters.
*/

    /* Parameter adjustments */
    a_dim1 = *lda;
    a_offset = 1 + a_dim1;
    a -= a_offset;

    /* Function Body */
    *info = 0;
    upper = lsame_(uplo, "U");
    if (! upper && ! lsame_(uplo, "L")) {
	*info = -1;
    } else if (*n < 0) {
	*info = -2;
    } else if (*lda < max(1,*n)) {
	*info = -4;
    }
    if (*info != 0) {
	i__1 = -(*info);
	xerbla_("SPOTF2", &i__1);
	return 0;
    }

/*     Quick return if possible */

    if (*n == 0) {
	return 0;
    }

    if (upper) {

/*        Compute the Cholesky factorization A = U'*U. */

	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {

/*           Compute U(J,J) and test for non-positive-definiteness. */

	    i__2 = j - 1;
	    ajj = a[j + j * a_dim1] - sdot_(&i__2, &a[j * a_dim1 + 1], &c__1,
		    &a[j * a_dim1 + 1], &c__1);
	    if (ajj <= 0.f) {
		a[j + j * a_dim1] = ajj;
		goto L30;
	    }
	    ajj = sqrt(ajj);
	    a[j + j * a_dim1] = ajj;

/*           Compute elements J+1:N of row J. */

	    if (j < *n) {
		i__2 = j - 1;
		i__3 = *n - j;
		sgemv_("Transpose", &i__2, &i__3, &c_b181, &a[(j + 1) *
			a_dim1 + 1], lda, &a[j * a_dim1 + 1], &c__1, &c_b164,
			&a[j + (j + 1) * a_dim1], lda);
		i__2 = *n - j;
		r__1 = 1.f / ajj;
		sscal_(&i__2, &r__1, &a[j + (j + 1) * a_dim1], lda);
	    }
/* L10: */
	}
    } else {

/*        Compute the Cholesky factorization A = L*L'. */

	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {

/*           Compute L(J,J) and test for non-positive-definiteness. */

	    i__2 = j - 1;
	    ajj = a[j + j * a_dim1] - sdot_(&i__2, &a[j + a_dim1], lda, &a[j
		    + a_dim1], lda);
	    if (ajj <= 0.f) {
		a[j + j * a_dim1] = ajj;
		goto L30;
	    }
	    ajj = sqrt(ajj);
	    a[j + j * a_dim1] = ajj;

/*           Compute elements J+1:N of column J. */

	    if (j < *n) {
		i__2 = *n - j;
		i__3 = j - 1;
		sgemv_("No transpose", &i__2, &i__3, &c_b181, &a[j + 1 +
			a_dim1], lda, &a[j + a_dim1], lda, &c_b164, &a[j + 1
			+ j * a_dim1], &c__1);
		i__2 = *n - j;
		r__1 = 1.f / ajj;
		sscal_(&i__2, &r__1, &a[j + 1 + j * a_dim1], &c__1);
	    }
/* L20: */
	}
    }
    goto L40;

L30:
    *info = j;

L40:
    return 0;

/*     End of SPOTF2 */

}